

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all.hpp
# Opt level: O1

duration __thiscall
timertt::details::
manager_impl_template<timertt::details::timer_wheel_engine<timertt::thread_safety::unsafe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>>
::timeout_before_nearest_timer<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
          (manager_impl_template<timertt::details::timer_wheel_engine<timertt::thread_safety::unsafe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>>
           *this,duration<long,_std::ratio<1L,_1000000000L>_> default_timeout)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  lVar3 = *(long *)(this + 0x48);
  lVar1 = *(long *)(this + 0x40);
  if (lVar3 == 0 && lVar1 == 0) {
    lVar2 = 0;
  }
  else if (this[0x70] ==
           (manager_impl_template<timertt::details::timer_wheel_engine<timertt::thread_safety::unsafe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>>
            )0x0) {
    lVar2 = std::chrono::_V2::steady_clock::now();
  }
  else {
    lVar2 = *(long *)(this + 0x68);
  }
  if (lVar3 != 0 || lVar1 != 0) {
    lVar3 = std::chrono::_V2::steady_clock::now();
    default_timeout.__r = 0;
    if (lVar3 <= lVar2) {
      default_timeout.__r = lVar2 - lVar3;
    }
  }
  return (duration)default_timeout.__r;
}

Assistant:

monotonic_clock::duration
	timeout_before_nearest_timer(
		//! Default timeout value which will be used if there is no any timers.
		DURATION default_timeout )
	{
		auto r = this->nearest_time_point();
		if( std::get<0>( r ) )
		{
			auto now = monotonic_clock::now();
			const auto & f = std::get<1>( r );
			if( now > f )
				return monotonic_clock::duration( 0 );
			else
				return (f - now);
		}
		else
			return default_timeout;
	}